

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall
solitaire::Context::Context
          (Context *this,
          unique_ptr<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
          *solitaire,FoundationPileColliders *foundationPileColliders,
          TableauPileColliders *tableauPileColliders,
          unique_ptr<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
          *stockPileCollider,
          unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
          *newGameButton,
          unique_ptr<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
          *undoButton)

{
  long lVar1;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__Context_001152e8;
  (this->solitaire)._M_t.
  super___uniq_ptr_impl<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Solitaire_*,_std::default_delete<solitaire::interfaces::Solitaire>_>
  .super__Head_base<0UL,_solitaire::interfaces::Solitaire_*,_false>._M_head_impl =
       (solitaire->_M_t).
       super___uniq_ptr_impl<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::interfaces::Solitaire_*,_std::default_delete<solitaire::interfaces::Solitaire>_>
       .super__Head_base<0UL,_solitaire::interfaces::Solitaire_*,_false>._M_head_impl;
  (solitaire->_M_t).
  super___uniq_ptr_impl<solitaire::interfaces::Solitaire,_std::default_delete<solitaire::interfaces::Solitaire>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Solitaire_*,_std::default_delete<solitaire::interfaces::Solitaire>_>
  .super__Head_base<0UL,_solitaire::interfaces::Solitaire_*,_false>._M_head_impl = (Solitaire *)0x0;
  lVar1 = 0;
  do {
    (this->foundationPileColliders)._M_elems[lVar1]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
    _M_head_impl = foundationPileColliders->_M_elems[lVar1]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>
                   ._M_head_impl;
    foundationPileColliders->_M_elems[lVar1]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::FoundationPileCollider,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::FoundationPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::FoundationPileCollider_*,_false>.
    _M_head_impl = (FoundationPileCollider *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = 0;
  do {
    (this->tableauPileColliders)._M_elems[lVar1]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = tableauPileColliders->_M_elems[lVar1]._M_t.
                   super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
                   .
                   super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>
                   ._M_head_impl;
    tableauPileColliders->_M_elems[lVar1]._M_t.
    super___uniq_ptr_impl<solitaire::colliders::interfaces::TableauPileCollider,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    ._M_t.
    super__Tuple_impl<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::TableauPileCollider>_>
    .super__Head_base<0UL,_solitaire::colliders::interfaces::TableauPileCollider_*,_false>.
    _M_head_impl = (TableauPileCollider *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  (this->stockPileCollider)._M_t.
  super___uniq_ptr_impl<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_false>._M_head_impl
       = (stockPileCollider->_M_t).
         super___uniq_ptr_impl<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
         ._M_t.
         super__Tuple_impl<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
         .super__Head_base<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_false>.
         _M_head_impl;
  (stockPileCollider->_M_t).
  super___uniq_ptr_impl<solitaire::colliders::interfaces::StockPileCollider,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_std::default_delete<solitaire::colliders::interfaces::StockPileCollider>_>
  .super__Head_base<0UL,_solitaire::colliders::interfaces::StockPileCollider_*,_false>._M_head_impl
       = (StockPileCollider *)0x0;
  (this->newGameButton)._M_t.
  super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
  .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl =
       (newGameButton->_M_t).
       super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
       .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl;
  (newGameButton->_M_t).
  super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
  .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl = (Button *)0x0;
  (this->undoButton)._M_t.
  super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
  .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl =
       (undoButton->_M_t).
       super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
       ._M_t.
       super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
       .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl;
  (undoButton->_M_t).
  super___uniq_ptr_impl<solitaire::interfaces::Button,_std::default_delete<solitaire::interfaces::Button>_>
  ._M_t.
  super__Tuple_impl<0UL,_solitaire::interfaces::Button_*,_std::default_delete<solitaire::interfaces::Button>_>
  .super__Head_base<0UL,_solitaire::interfaces::Button_*,_false>._M_head_impl = (Button *)0x0;
  return;
}

Assistant:

Context::Context(std::unique_ptr<Solitaire> solitaire,
                 FoundationPileColliders foundationPileColliders,
                 TableauPileColliders tableauPileColliders,
                 std::unique_ptr<StockPileCollider> stockPileCollider,
                 std::unique_ptr<Button> newGameButton,
                 std::unique_ptr<Button> undoButton):
    solitaire {std::move(solitaire)},
    foundationPileColliders {std::move(foundationPileColliders)},
    tableauPileColliders {std::move(tableauPileColliders)},
    stockPileCollider {std::move(stockPileCollider)},
    newGameButton {std::move(newGameButton)},
    undoButton {std::move(undoButton)} {
}